

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O2

bool __thiscall ExtendedMatrix::SwapColumns(ExtendedMatrix *this,int first_column,int second_column)

{
  bool bVar1;
  int iVar2;
  int second_column_00;
  int first_column_00;
  Permutation *this_00;
  
  iVar2 = Matrix::GetNumColumns(&this->main_);
  if (second_column < iVar2 && first_column < iVar2) {
    bVar1 = Matrix::SwapColumns(&this->main_,first_column,second_column);
    if (bVar1) {
      this_00 = &this->main_column_permutation_;
      second_column_00 = second_column;
      first_column_00 = first_column;
LAB_0010c559:
      Permutation::Transposition(this_00,first_column_00,second_column_00);
      return true;
    }
  }
  else {
    second_column_00 = second_column - iVar2;
    first_column_00 = first_column - iVar2;
    if ((iVar2 <= first_column && iVar2 <= second_column) &&
       (bVar1 = Matrix::SwapColumns(&this->extension_,first_column_00,second_column_00), bVar1)) {
      this_00 = &this->extension_column_permutation_;
      goto LAB_0010c559;
    }
  }
  return false;
}

Assistant:

bool ExtendedMatrix::SwapColumns(int first_column, int second_column) {
  int m = main_.GetNumColumns();
  bool result = false;
  if (first_column < m && second_column < m) {
    result = main_.SwapColumns(first_column, second_column);
    if (result) {
      main_column_permutation_.Transposition(first_column, second_column);
    }
  } else if (first_column >= m && second_column >= m) {
    result = extension_.SwapColumns(first_column - m, second_column - m);
    if (result) {
      extension_column_permutation_.Transposition(first_column - m, second_column - m);
    }
  }

  return result;
}